

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_line_segments.h
# Opt level: O2

BBox3fa * __thiscall
embree::avx512::LineSegmentsISA::vbounds
          (BBox3fa *__return_storage_ptr__,LineSegmentsISA *this,Vec3fa *ofs,float scale,
          float r_scale0,LinearSpace3fa *space,size_t i,size_t itime)

{
  float fVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  uint uVar4;
  BufferView<embree::Vec3fx> *pBVar5;
  char *pcVar6;
  size_t sVar7;
  undefined1 auVar8 [16];
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  long lVar13;
  long lVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  
  pBVar5 = (this->super_LineSegments).vertices.items;
  uVar4 = *(uint *)(*(long *)&(this->super_LineSegments).super_Geometry.field_0x58 +
                   i * *(long *)&(this->super_LineSegments).field_0x68);
  pcVar6 = pBVar5[itime].super_RawBufferView.ptr_ofs;
  sVar7 = pBVar5[itime].super_RawBufferView.stride;
  lVar14 = uVar4 * sVar7;
  lVar13 = (uVar4 + 1) * sVar7;
  auVar8 = vsubps_avx(*(undefined1 (*) [16])(pcVar6 + lVar14),(undefined1  [16])ofs->field_0);
  auVar18._0_4_ = scale * auVar8._0_4_;
  auVar18._4_4_ = scale * auVar8._4_4_;
  auVar18._8_4_ = scale * auVar8._8_4_;
  auVar18._12_4_ = scale * auVar8._12_4_;
  auVar21._4_4_ = auVar18._0_4_;
  auVar21._0_4_ = auVar18._0_4_;
  auVar21._8_4_ = auVar18._0_4_;
  auVar21._12_4_ = auVar18._0_4_;
  auVar8 = vshufps_avx(auVar18,auVar18,0x55);
  auVar17 = vshufps_avx(auVar18,auVar18,0xaa);
  aVar2 = (space->vx).field_0;
  aVar3 = (space->vy).field_0;
  fVar9 = (space->vz).field_0.m128[0];
  fVar10 = (space->vz).field_0.m128[1];
  fVar11 = (space->vz).field_0.m128[2];
  fVar12 = (space->vz).field_0.m128[3];
  auVar19._0_4_ = fVar9 * auVar17._0_4_;
  auVar19._4_4_ = fVar10 * auVar17._4_4_;
  auVar19._8_4_ = fVar11 * auVar17._8_4_;
  auVar19._12_4_ = fVar12 * auVar17._12_4_;
  auVar8 = vfmadd231ps_fma(auVar19,(undefined1  [16])aVar3,auVar8);
  auVar8 = vfmadd231ps_fma(auVar8,(undefined1  [16])aVar2,auVar21);
  fVar1 = (this->super_LineSegments).maxRadiusScale;
  auVar18 = ZEXT416((uint)(scale * r_scale0 * fVar1 * *(float *)(pcVar6 + lVar14 + 0xc)));
  auVar8 = vinsertps_avx(auVar8,auVar18,0x30);
  auVar17 = vsubps_avx(*(undefined1 (*) [16])(pcVar6 + lVar13),(undefined1  [16])ofs->field_0);
  auVar15._0_4_ = scale * auVar17._0_4_;
  auVar15._4_4_ = scale * auVar17._4_4_;
  auVar15._8_4_ = scale * auVar17._8_4_;
  auVar15._12_4_ = scale * auVar17._12_4_;
  auVar20._4_4_ = auVar15._0_4_;
  auVar20._0_4_ = auVar15._0_4_;
  auVar20._8_4_ = auVar15._0_4_;
  auVar20._12_4_ = auVar15._0_4_;
  auVar17 = vshufps_avx(auVar15,auVar15,0x55);
  auVar15 = vshufps_avx(auVar15,auVar15,0xaa);
  auVar16._0_4_ = fVar9 * auVar15._0_4_;
  auVar16._4_4_ = fVar10 * auVar15._4_4_;
  auVar16._8_4_ = fVar11 * auVar15._8_4_;
  auVar16._12_4_ = fVar12 * auVar15._12_4_;
  auVar17 = vfmadd231ps_fma(auVar16,(undefined1  [16])aVar3,auVar17);
  auVar17 = vfmadd231ps_fma(auVar17,(undefined1  [16])aVar2,auVar20);
  auVar16 = ZEXT416((uint)(scale * r_scale0 * fVar1 * *(float *)(pcVar6 + lVar13 + 0xc)));
  auVar17 = vinsertps_avx(auVar17,auVar16,0x30);
  auVar15 = vminps_avx(auVar8,auVar17);
  auVar8 = vmaxps_avx(auVar8,auVar17);
  auVar17 = vmaxss_avx(auVar16,auVar18);
  fVar1 = fVar1 * auVar17._0_4_;
  auVar17._4_4_ = fVar1;
  auVar17._0_4_ = fVar1;
  auVar17._8_4_ = fVar1;
  auVar17._12_4_ = fVar1;
  aVar2 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vsubps_avx(auVar15,auVar17);
  (__return_storage_ptr__->lower).field_0 = aVar2;
  (__return_storage_ptr__->upper).field_0.m128[0] = auVar8._0_4_ + fVar1;
  (__return_storage_ptr__->upper).field_0.m128[1] = auVar8._4_4_ + fVar1;
  (__return_storage_ptr__->upper).field_0.m128[2] = auVar8._8_4_ + fVar1;
  (__return_storage_ptr__->upper).field_0.m128[3] = auVar8._12_4_ + fVar1;
  return __return_storage_ptr__;
}

Assistant:

BBox3fa vbounds(const Vec3fa& ofs, const float scale, const float r_scale0, const LinearSpace3fa& space, size_t i, size_t itime = 0) const {
        return bounds(ofs,scale,r_scale0,space,i,itime);
      }